

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator_type.cpp
# Opt level: O0

string * duckdb::PhysicalOperatorToString(PhysicalOperatorType type)

{
  undefined1 in_SIL;
  string *in_RDI;
  allocator local_6c;
  allocator local_6b;
  allocator local_6a;
  allocator local_69;
  allocator local_68;
  allocator local_67;
  allocator local_66;
  allocator local_65;
  allocator local_64;
  allocator local_63;
  allocator local_62;
  allocator local_61;
  allocator local_60;
  allocator local_5f;
  allocator local_5e;
  allocator local_5d;
  allocator local_5c;
  allocator local_5b;
  allocator local_5a;
  allocator local_59;
  allocator local_58;
  allocator local_57;
  allocator local_56;
  allocator local_55;
  allocator local_54;
  allocator local_53;
  allocator local_52;
  allocator local_51;
  allocator local_50;
  allocator local_4f;
  allocator local_4e;
  allocator local_4d;
  allocator local_4c;
  allocator local_4b;
  allocator local_4a;
  allocator local_49;
  allocator local_48;
  allocator local_47;
  allocator local_46;
  allocator local_45;
  allocator local_44;
  allocator local_43;
  allocator local_42;
  allocator local_41;
  allocator local_40;
  allocator local_3f;
  allocator local_3e;
  allocator local_3d;
  allocator local_3c;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25;
  allocator local_24;
  allocator local_23;
  allocator local_22;
  allocator local_21;
  allocator local_20;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [19];
  allocator local_a [10];
  
  switch(in_SIL) {
  case 0:
  default:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"INVALID",&local_6c);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_6c);
    break;
  case 1:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"ORDER_BY",&local_21);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_21);
    break;
  case 2:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"LIMIT",&local_22);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_22);
    break;
  case 3:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"STREAMING_LIMIT",&local_24);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_24);
    break;
  case 4:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"LIMIT_PERCENT",&local_23);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_23);
    break;
  case 5:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"TOP_N",&local_27);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case 6:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"WINDOW",&local_28);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case 7:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"UNNEST",&local_2a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    break;
  case 8:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"UNGROUPED_AGGREGATE",&local_2b);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2b);
    break;
  case 9:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"HASH_GROUP_BY",&local_2c);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2c);
    break;
  case 10:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"PERFECT_HASH_GROUP_BY",&local_2d);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2d);
    break;
  case 0xb:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"PARTITIONED_AGGREGATE",&local_2e);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    break;
  case 0xc:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"FILTER",&local_2f);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2f);
    break;
  case 0xd:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"PROJECTION",&local_30);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_30);
    break;
  case 0xe:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"COPY_TO_FILE",&local_31);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
    break;
  case 0xf:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"BATCH_COPY_TO_FILE",&local_32);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_32);
    break;
  case 0x10:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"RESERVOIR_SAMPLE",&local_25);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_25);
    break;
  case 0x11:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"STREAMING_SAMPLE",&local_26);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case 0x12:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"STREAMING_WINDOW",&local_29);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  case 0x13:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"PIVOT",&local_68);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_68);
    break;
  case 0x14:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"COPY_DATABASE",&local_69);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_69);
    break;
  case 0x15:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"TABLE_SCAN",local_a);
    ::std::allocator<char>::~allocator((allocator<char> *)local_a);
    break;
  case 0x16:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"DUMMY_SCAN",local_1d);
    ::std::allocator<char>::~allocator((allocator<char> *)local_1d);
    break;
  case 0x17:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"COLUMN_DATA_SCAN",&local_1f);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1f);
    break;
  case 0x18:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"CHUNK_SCAN",&local_1e);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1e);
    break;
  case 0x19:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"REC_CTE_SCAN",&local_4f);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_4f);
    break;
  case 0x1a:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"REC_REC_CTE_SCAN",&local_50);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_50);
    break;
  case 0x1b:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"CTE_SCAN",&local_51);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_51);
    break;
  case 0x1c:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"DELIM_SCAN",&local_20);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_20);
    break;
  case 0x1d:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"EXPRESSION_SCAN",&local_52);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_52);
    break;
  case 0x1e:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"POSITIONAL_SCAN",&local_3d);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3d);
    break;
  case 0x1f:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"BLOCKWISE_NL_JOIN",&local_35);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_35);
    break;
  case 0x20:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"NESTED_LOOP_JOIN",&local_36);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_36);
    break;
  case 0x21:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"HASH_JOIN",&local_37);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_37);
    break;
  case 0x22:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"CROSS_PRODUCT",&local_3b);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3b);
    break;
  case 0x23:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"PIECEWISE_MERGE_JOIN",&local_38);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_38);
    break;
  case 0x24:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"IE_JOIN",&local_39);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
    break;
  case 0x25:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"LEFT_DELIM_JOIN",&local_33);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_33);
    break;
  case 0x26:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"RIGHT_DELIM_JOIN",&local_34);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_34);
    break;
  case 0x27:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"POSITIONAL_JOIN",&local_3c);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3c);
    break;
  case 0x28:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"ASOF_JOIN",&local_3a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3a);
    break;
  case 0x29:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"UNION",&local_3e);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3e);
    break;
  case 0x2a:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"REC_CTE",&local_4c);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_4c);
    break;
  case 0x2b:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"REC_KEY_CTE",&local_4d);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_4d);
    break;
  case 0x2c:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"CTE",&local_4e);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_4e);
    break;
  case 0x2d:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"INSERT",&local_3f);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3f);
    break;
  case 0x2e:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"BATCH_INSERT",&local_40);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_40);
    break;
  case 0x2f:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"DELETE",&local_41);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
    break;
  case 0x30:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"UPDATE",&local_42);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_42);
    break;
  case 0x31:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"CREATE_TABLE",&local_44);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_44);
    break;
  case 0x32:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"CREATE_TABLE_AS",&local_45);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_45);
    break;
  case 0x33:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"BATCH_CREATE_TABLE_AS",&local_46);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_46);
    break;
  case 0x34:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"CREATE_INDEX",&local_47);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_47);
    break;
  case 0x35:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"ALTER",&local_53);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_53);
    break;
  case 0x36:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"CREATE_SEQUENCE",&local_54);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_54);
    break;
  case 0x37:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"CREATE_VIEW",&local_55);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_55);
    break;
  case 0x38:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"CREATE_SCHEMA",&local_56);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_56);
    break;
  case 0x39:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"CREATE_MACRO",&local_57);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_57);
    break;
  case 0x3a:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"DROP",&local_59);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
    break;
  case 0x3b:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"PRAGMA",&local_5a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_5a);
    break;
  case 0x3c:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"TRANSACTION",&local_5b);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_5b);
    break;
  case 0x3d:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"CREATE_TYPE",&local_63);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_63);
    break;
  case 0x3e:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"ATTACH",&local_64);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_64);
    break;
  case 0x3f:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"DETACH",&local_65);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_65);
    break;
  case 0x40:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"EXPLAIN",&local_48);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_48);
    break;
  case 0x41:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"EXPLAIN_ANALYZE",&local_49);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_49);
    break;
  case 0x42:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"EMPTY_RESULT",&local_43);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_43);
    break;
  case 0x43:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"EXECUTE",&local_4a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_4a);
    break;
  case 0x44:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"PREPARE",&local_5c);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_5c);
    break;
  case 0x45:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"VACUUM",&local_4b);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_4b);
    break;
  case 0x46:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"EXPORT",&local_5d);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_5d);
    break;
  case 0x47:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"SET",&local_5e);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_5e);
    break;
  case 0x48:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"SET_VARIABLE",&local_5f);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_5f);
    break;
  case 0x49:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"LOAD",&local_61);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_61);
    break;
  case 0x4a:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"INOUT_FUNCTION",&local_62);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_62);
    break;
  case 0x4b:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"RESULT_COLLECTOR",&local_66);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_66);
    break;
  case 0x4c:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"RESET",&local_60);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_60);
    break;
  case 0x4d:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"EXTENSION",&local_67);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_67);
    break;
  case 0x4e:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"VERIFY_VECTOR",&local_6a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_6a);
    break;
  case 0x4f:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"UPDATE_EXTENSIONS",&local_6b);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_6b);
    break;
  case 0x50:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"CREATE_SECRET",&local_58);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_58);
  }
  return in_RDI;
}

Assistant:

string PhysicalOperatorToString(PhysicalOperatorType type) {
	switch (type) {
	case PhysicalOperatorType::TABLE_SCAN:
		return "TABLE_SCAN";
	case PhysicalOperatorType::DUMMY_SCAN:
		return "DUMMY_SCAN";
	case PhysicalOperatorType::CHUNK_SCAN:
		return "CHUNK_SCAN";
	case PhysicalOperatorType::COLUMN_DATA_SCAN:
		return "COLUMN_DATA_SCAN";
	case PhysicalOperatorType::DELIM_SCAN:
		return "DELIM_SCAN";
	case PhysicalOperatorType::ORDER_BY:
		return "ORDER_BY";
	case PhysicalOperatorType::LIMIT:
		return "LIMIT";
	case PhysicalOperatorType::LIMIT_PERCENT:
		return "LIMIT_PERCENT";
	case PhysicalOperatorType::STREAMING_LIMIT:
		return "STREAMING_LIMIT";
	case PhysicalOperatorType::RESERVOIR_SAMPLE:
		return "RESERVOIR_SAMPLE";
	case PhysicalOperatorType::STREAMING_SAMPLE:
		return "STREAMING_SAMPLE";
	case PhysicalOperatorType::TOP_N:
		return "TOP_N";
	case PhysicalOperatorType::WINDOW:
		return "WINDOW";
	case PhysicalOperatorType::STREAMING_WINDOW:
		return "STREAMING_WINDOW";
	case PhysicalOperatorType::UNNEST:
		return "UNNEST";
	case PhysicalOperatorType::UNGROUPED_AGGREGATE:
		return "UNGROUPED_AGGREGATE";
	case PhysicalOperatorType::HASH_GROUP_BY:
		return "HASH_GROUP_BY";
	case PhysicalOperatorType::PERFECT_HASH_GROUP_BY:
		return "PERFECT_HASH_GROUP_BY";
	case PhysicalOperatorType::PARTITIONED_AGGREGATE:
		return "PARTITIONED_AGGREGATE";
	case PhysicalOperatorType::FILTER:
		return "FILTER";
	case PhysicalOperatorType::PROJECTION:
		return "PROJECTION";
	case PhysicalOperatorType::COPY_TO_FILE:
		return "COPY_TO_FILE";
	case PhysicalOperatorType::BATCH_COPY_TO_FILE:
		return "BATCH_COPY_TO_FILE";
	case PhysicalOperatorType::LEFT_DELIM_JOIN:
		return "LEFT_DELIM_JOIN";
	case PhysicalOperatorType::RIGHT_DELIM_JOIN:
		return "RIGHT_DELIM_JOIN";
	case PhysicalOperatorType::BLOCKWISE_NL_JOIN:
		return "BLOCKWISE_NL_JOIN";
	case PhysicalOperatorType::NESTED_LOOP_JOIN:
		return "NESTED_LOOP_JOIN";
	case PhysicalOperatorType::HASH_JOIN:
		return "HASH_JOIN";
	case PhysicalOperatorType::PIECEWISE_MERGE_JOIN:
		return "PIECEWISE_MERGE_JOIN";
	case PhysicalOperatorType::IE_JOIN:
		return "IE_JOIN";
	case PhysicalOperatorType::ASOF_JOIN:
		return "ASOF_JOIN";
	case PhysicalOperatorType::CROSS_PRODUCT:
		return "CROSS_PRODUCT";
	case PhysicalOperatorType::POSITIONAL_JOIN:
		return "POSITIONAL_JOIN";
	case PhysicalOperatorType::POSITIONAL_SCAN:
		return "POSITIONAL_SCAN";
	case PhysicalOperatorType::UNION:
		return "UNION";
	case PhysicalOperatorType::INSERT:
		return "INSERT";
	case PhysicalOperatorType::BATCH_INSERT:
		return "BATCH_INSERT";
	case PhysicalOperatorType::DELETE_OPERATOR:
		return "DELETE";
	case PhysicalOperatorType::UPDATE:
		return "UPDATE";
	case PhysicalOperatorType::EMPTY_RESULT:
		return "EMPTY_RESULT";
	case PhysicalOperatorType::CREATE_TABLE:
		return "CREATE_TABLE";
	case PhysicalOperatorType::CREATE_TABLE_AS:
		return "CREATE_TABLE_AS";
	case PhysicalOperatorType::BATCH_CREATE_TABLE_AS:
		return "BATCH_CREATE_TABLE_AS";
	case PhysicalOperatorType::CREATE_INDEX:
		return "CREATE_INDEX";
	case PhysicalOperatorType::EXPLAIN:
		return "EXPLAIN";
	case PhysicalOperatorType::EXPLAIN_ANALYZE:
		return "EXPLAIN_ANALYZE";
	case PhysicalOperatorType::EXECUTE:
		return "EXECUTE";
	case PhysicalOperatorType::VACUUM:
		return "VACUUM";
	case PhysicalOperatorType::RECURSIVE_CTE:
		return "REC_CTE";
	case PhysicalOperatorType::RECURSIVE_KEY_CTE:
		return "REC_KEY_CTE";
	case PhysicalOperatorType::CTE:
		return "CTE";
	case PhysicalOperatorType::RECURSIVE_CTE_SCAN:
		return "REC_CTE_SCAN";
	case PhysicalOperatorType::RECURSIVE_RECURRING_CTE_SCAN:
		return "REC_REC_CTE_SCAN";
	case PhysicalOperatorType::CTE_SCAN:
		return "CTE_SCAN";
	case PhysicalOperatorType::EXPRESSION_SCAN:
		return "EXPRESSION_SCAN";
	case PhysicalOperatorType::ALTER:
		return "ALTER";
	case PhysicalOperatorType::CREATE_SEQUENCE:
		return "CREATE_SEQUENCE";
	case PhysicalOperatorType::CREATE_VIEW:
		return "CREATE_VIEW";
	case PhysicalOperatorType::CREATE_SCHEMA:
		return "CREATE_SCHEMA";
	case PhysicalOperatorType::CREATE_MACRO:
		return "CREATE_MACRO";
	case PhysicalOperatorType::CREATE_SECRET:
		return "CREATE_SECRET";
	case PhysicalOperatorType::DROP:
		return "DROP";
	case PhysicalOperatorType::PRAGMA:
		return "PRAGMA";
	case PhysicalOperatorType::TRANSACTION:
		return "TRANSACTION";
	case PhysicalOperatorType::PREPARE:
		return "PREPARE";
	case PhysicalOperatorType::EXPORT:
		return "EXPORT";
	case PhysicalOperatorType::SET:
		return "SET";
	case PhysicalOperatorType::SET_VARIABLE:
		return "SET_VARIABLE";
	case PhysicalOperatorType::RESET:
		return "RESET";
	case PhysicalOperatorType::LOAD:
		return "LOAD";
	case PhysicalOperatorType::INOUT_FUNCTION:
		return "INOUT_FUNCTION";
	case PhysicalOperatorType::CREATE_TYPE:
		return "CREATE_TYPE";
	case PhysicalOperatorType::ATTACH:
		return "ATTACH";
	case PhysicalOperatorType::DETACH:
		return "DETACH";
	case PhysicalOperatorType::RESULT_COLLECTOR:
		return "RESULT_COLLECTOR";
	case PhysicalOperatorType::EXTENSION:
		return "EXTENSION";
	case PhysicalOperatorType::PIVOT:
		return "PIVOT";
	case PhysicalOperatorType::COPY_DATABASE:
		return "COPY_DATABASE";
	case PhysicalOperatorType::VERIFY_VECTOR:
		return "VERIFY_VECTOR";
	case PhysicalOperatorType::UPDATE_EXTENSIONS:
		return "UPDATE_EXTENSIONS";
	case PhysicalOperatorType::INVALID:
		break;
	}
	return "INVALID";
}